

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O0

Error __thiscall
asmjit::CodeHolder::newNamedLabelId
          (CodeHolder *this,uint32_t *idOut,char *name,size_t nameLength,uint32_t type,
          uint32_t parentId)

{
  ulong uVar1;
  int iVar2;
  Error EVar3;
  int iVar4;
  ZoneHashNode *node_00;
  undefined4 extraout_var;
  ulong in_RCX;
  char *in_RDX;
  int *in_RSI;
  long in_RDI;
  int in_R8D;
  uint in_R9D;
  bool bVar5;
  char *nameExternal;
  uint32_t id;
  Error _err;
  size_t index;
  Error err;
  LabelEntry *le;
  uint32_t hVal;
  LabelEntry *node;
  uint32_t hMod;
  char *in_stack_000001a0;
  int in_stack_000001ac;
  char *in_stack_000001b0;
  size_t allocatedSize;
  size_t *in_stack_fffffffffffffdc0;
  undefined8 *puVar6;
  size_t in_stack_fffffffffffffdc8;
  uint in_stack_fffffffffffffdd0;
  undefined4 in_stack_fffffffffffffdd4;
  void *local_220;
  char *local_1c8;
  undefined4 local_1c0;
  uint local_1bc;
  undefined8 *local_1b8;
  uint local_1ac;
  uint local_1a8;
  int local_1a4;
  ulong local_1a0;
  char *local_198;
  int *local_190;
  Error local_180;
  long local_158;
  long local_150;
  undefined8 local_148;
  long local_140;
  ZoneVectorBase *local_138;
  undefined8 local_130;
  ZoneHashNode *local_128;
  int local_120;
  int local_11c;
  undefined8 *local_118;
  undefined8 **local_110;
  long *local_108;
  uint local_fc;
  undefined8 *local_f8;
  uint local_ec;
  char **local_e8;
  long local_e0;
  uint local_d4;
  ulong local_d0;
  char *local_c8;
  char **local_c0;
  ulong local_b8;
  undefined8 *local_b0;
  ulong local_a8;
  char *local_a0;
  undefined8 *local_98;
  ulong local_90;
  long local_88;
  undefined8 *local_80;
  undefined8 *local_78;
  long local_70;
  undefined8 local_68;
  long local_60;
  ZoneVectorBase *local_58;
  undefined8 local_48;
  ZoneHashNode *local_40;
  ZoneHashNode *local_38;
  undefined8 *local_30;
  char **local_28;
  undefined8 *local_20;
  undefined8 *local_18;
  int *local_10;
  uint *local_8;
  
  *in_RSI = 0;
  local_1a8 = in_R9D;
  local_1a4 = in_R8D;
  local_1a0 = in_RCX;
  local_198 = in_RDX;
  local_190 = in_RSI;
  local_1ac = anon_unknown_32::CodeHolder_hashNameAndFixLen(in_RDX,&local_1a0);
  if (local_1a0 == 0) {
    local_180 = 0x11;
  }
  else if (local_1a0 < 0x801) {
    if (local_1a4 == 1) {
      local_fc = local_1a8;
      local_150 = in_RDI + 0xf8;
      if (*(ulong *)(in_RDI + 0x100) <= (ulong)(local_1a8 - 0x100)) {
        return 0x12;
      }
      local_1ac = local_1a8 ^ local_1ac;
    }
    else {
      if (local_1a4 != 2) {
        return 3;
      }
      if (local_1a8 != 0) {
        return 0x13;
      }
    }
    local_e0 = in_RDI + 0x128;
    local_c0 = &local_1c8;
    local_c8 = local_198;
    local_d0 = local_1a0;
    local_d4 = local_1ac;
    local_1c8 = local_198;
    local_1c0 = (int)local_1a0;
    local_1bc = local_1ac;
    local_e8 = &local_1c8;
    local_ec = local_1ac % *(uint *)(in_RDI + 0x138);
    local_f8 = *(undefined8 **)(*(long *)(in_RDI + 0x140) + (ulong)local_ec * 8);
    while( true ) {
      bVar5 = false;
      if (local_f8 != (undefined8 *)0x0) {
        local_28 = local_e8;
        local_30 = local_f8;
        local_20 = local_f8;
        local_10 = (int *)(local_f8 + 6);
        bVar5 = false;
        if (*local_10 == *(int *)(local_e8 + 1)) {
          local_18 = local_f8;
          local_8 = (uint *)(local_f8 + 6);
          if (*local_8 < 0xc) {
            local_220 = (void *)((long)local_f8 + 0x34);
          }
          else {
            local_220 = (void *)local_f8[7];
          }
          iVar2 = memcmp(local_220,*local_e8,(ulong)*(uint *)(local_e8 + 1));
          bVar5 = iVar2 == 0;
        }
        bVar5 = (bool)(bVar5 ^ 1);
      }
      if (!bVar5) break;
      local_f8 = (undefined8 *)*local_f8;
    }
    local_1b8 = local_f8;
    if (local_f8 == (undefined8 *)0x0) {
      local_158 = in_RDI + 0xf8;
      uVar1 = *(ulong *)(in_RDI + 0x100);
      if (uVar1 < 0xffffff00) {
        local_138 = (ZoneVectorBase *)(in_RDI + 0xf8);
        local_140 = in_RDI + 0x80;
        local_148 = 1;
        if (*(long *)(in_RDI + 0x108) == *(long *)(in_RDI + 0x100)) {
          local_68 = 1;
          local_60 = local_140;
          local_58 = local_138;
          EVar3 = ZoneVectorBase::_grow
                            (local_138,
                             (ZoneHeap *)
                             CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                             in_stack_fffffffffffffdc8,(size_t)in_stack_fffffffffffffdc0);
        }
        else {
          EVar3 = 0;
        }
        local_180 = EVar3;
        if (EVar3 == 0) {
          node_00 = (ZoneHashNode *)(in_RDI + 0x80);
          local_130 = 0x40;
          local_48 = 0x40;
          local_128 = node_00;
          local_40 = node_00;
          local_38 = node_00;
          if (*(long *)node_00 == 0) {
            DebugUtils::assertionFailed(in_stack_000001b0,in_stack_000001ac,in_stack_000001a0);
          }
          local_1b8 = (undefined8 *)
                      ZoneHeap::_allocZeroed
                                ((ZoneHeap *)(ulong)in_stack_fffffffffffffdd0,(size_t)node_00,
                                 in_stack_fffffffffffffdc0);
          if (local_1b8 == (undefined8 *)0x0) {
            local_180 = 1;
          }
          else {
            local_120 = (int)uVar1;
            iVar2 = local_120 + 0x100;
            *(uint *)(local_1b8 + 1) = local_1ac;
            *(int *)((long)local_1b8 + 0xc) = iVar2;
            *(undefined1 *)(local_1b8 + 2) = (undefined1)local_1a4;
            *(undefined4 *)((long)local_1b8 + 0x14) = 0;
            *(undefined4 *)(local_1b8 + 3) = 0xffffffff;
            local_1b8[4] = 0;
            local_b0 = local_1b8 + 6;
            local_b8 = local_1a0;
            local_11c = iVar2;
            local_118 = local_1b8;
            if (local_1a0 < 0xc) {
              puVar6 = local_1b8 + 6;
              local_a0 = local_198;
              local_a8 = local_1a0;
              local_98 = puVar6;
              if (0xb < local_1a0) {
                DebugUtils::assertionFailed(in_stack_000001b0,in_stack_000001ac,in_stack_000001a0);
              }
              *(int *)puVar6 = (int)local_1a0;
              memcpy((void *)((long)local_1b8 + 0x34),local_198,local_1a0);
              *(undefined1 *)((long)puVar6 + local_a8 + 4) = 0;
            }
            else {
              iVar4 = Zone::dup((Zone *)(in_RDI + 0x60),(int)local_198);
              local_88 = CONCAT44(extraout_var,iVar4);
              if (local_88 == 0) {
                return 1;
              }
              local_80 = local_1b8 + 6;
              local_90 = local_1a0;
              if (local_1a0 < 0xc) {
                DebugUtils::assertionFailed(in_stack_000001b0,in_stack_000001ac,in_stack_000001a0);
              }
              if (0xffffffff < local_1a0) {
                DebugUtils::assertionFailed(in_stack_000001b0,in_stack_000001ac,in_stack_000001a0);
              }
              *(int *)local_80 = (int)local_1a0;
              local_1b8[7] = local_88;
            }
            local_108 = (long *)(in_RDI + 0xf8);
            local_110 = &local_1b8;
            if (*(ulong *)(in_RDI + 0x108) <= *(ulong *)(in_RDI + 0x100)) {
              DebugUtils::assertionFailed(in_stack_000001b0,in_stack_000001ac,in_stack_000001a0);
            }
            *(undefined8 **)(*local_108 + *(long *)(in_RDI + 0x100) * 8) = local_1b8;
            *(long *)(in_RDI + 0x100) = *(long *)(in_RDI + 0x100) + 1;
            local_70 = in_RDI + 0x128;
            local_78 = local_1b8;
            ZoneHashBase::_put((ZoneHashBase *)CONCAT44(EVar3,in_stack_fffffffffffffdd0),node_00);
            *local_190 = iVar2;
            local_180 = 0;
          }
        }
      }
      else {
        local_180 = 0xd;
      }
    }
    else {
      local_180 = 0xf;
    }
  }
  else {
    local_180 = 0x10;
  }
  return local_180;
}

Assistant:

Error CodeHolder::newNamedLabelId(uint32_t& idOut, const char* name, size_t nameLength, uint32_t type, uint32_t parentId) noexcept {
  idOut = 0;
  uint32_t hVal = CodeHolder_hashNameAndFixLen(name, nameLength);

  if (ASMJIT_UNLIKELY(nameLength == 0))
    return DebugUtils::errored(kErrorInvalidLabelName);

  if (ASMJIT_UNLIKELY(nameLength > Globals::kMaxLabelLength))
    return DebugUtils::errored(kErrorLabelNameTooLong);

  switch (type) {
    case Label::kTypeLocal:
      if (ASMJIT_UNLIKELY(Operand::unpackId(parentId) >= _labels.getLength()))
        return DebugUtils::errored(kErrorInvalidParentLabel);

      hVal ^= parentId;
      break;

    case Label::kTypeGlobal:
      if (ASMJIT_UNLIKELY(parentId != 0))
        return DebugUtils::errored(kErrorNonLocalLabelCantHaveParent);

      break;

    default:
      return DebugUtils::errored(kErrorInvalidArgument);
  }

  // Don't allow to insert duplicates. Local labels allow duplicates that have
  // different id, this is already accomplished by having a different hashes
  // between the same label names having different parent labels.
  LabelEntry* le = _namedLabels.get(LabelByName(name, nameLength, hVal));
  if (ASMJIT_UNLIKELY(le))
    return DebugUtils::errored(kErrorLabelAlreadyDefined);

  Error err = kErrorOk;
  size_t index = _labels.getLength();

  if (ASMJIT_UNLIKELY(index >= Operand::kPackedIdCount))
    return DebugUtils::errored(kErrorLabelIndexOverflow);

  ASMJIT_PROPAGATE(_labels.willGrow(&_baseHeap));
  le = _baseHeap.allocZeroedT<LabelEntry>();

  if (ASMJIT_UNLIKELY(!le))
    return  DebugUtils::errored(kErrorNoHeapMemory);

  uint32_t id = Operand::packId(static_cast<uint32_t>(index));
  le->_hVal = hVal;
  le->_setId(id);
  le->_type = static_cast<uint8_t>(type);
  le->_parentId = 0;
  le->_sectionId = SectionEntry::kInvalidId;
  le->_offset = 0;

  if (le->_name.mustEmbed(nameLength)) {
    le->_name.setEmbedded(name, nameLength);
  }
  else {
    char* nameExternal = static_cast<char*>(_dataZone.dup(name, nameLength, true));
    if (ASMJIT_UNLIKELY(!nameExternal))
      return DebugUtils::errored(kErrorNoHeapMemory);
    le->_name.setExternal(nameExternal, nameLength);
  }

  _labels.appendUnsafe(le);
  _namedLabels.put(le);

  idOut = id;
  return err;
}